

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3VdbeChangeToNoop(Vdbe *p,int addr)

{
  Op *pOVar1;
  Op *pOVar2;
  
  pOVar2 = p->aOp;
  if (pOVar2 != (Op *)0x0) {
    freeP4(p->db,(int)pOVar2[addr].p4type,pOVar2[addr].p4.p);
    pOVar1 = pOVar2 + addr;
    pOVar1->opcode = '\0';
    pOVar1->p4type = '\0';
    pOVar1->opflags = '\0';
    pOVar1->p5 = '\0';
    pOVar1->p1 = 0;
    pOVar1->p2 = 0;
    pOVar1->p3 = 0;
    pOVar2[addr].p4.p = (void *)0x0;
    pOVar2[addr].opcode = 0x95;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeChangeToNoop(Vdbe *p, int addr){
  if( p->aOp ){
    VdbeOp *pOp = &p->aOp[addr];
    sqlite3 *db = p->db;
    freeP4(db, pOp->p4type, pOp->p4.p);
    memset(pOp, 0, sizeof(pOp[0]));
    pOp->opcode = OP_Noop;
  }
}